

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

BSDF * __thiscall
pbrt::DiffuseTransmissionMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,
          DiffuseTransmissionMaterial *this,SampledWavelengths *param_5,int *param_6,
          undefined8 param_7,undefined8 param_8,undefined8 param_9,ulong param_10,
          undefined8 param_11,undefined8 param_12,undefined8 param_13,undefined8 param_14,
          undefined8 param_15,undefined8 param_16)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined8 uVar3;
  byte bVar4;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  byte bVar5;
  undefined1 auVar6 [32];
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  undefined8 uVar19;
  UniversalTextureEvaluator local_d9;
  undefined1 local_d8 [8];
  Float FStack_d0;
  Float FStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  BxDFHandle local_b8;
  uintptr_t local_b0;
  uintptr_t local_a8;
  uintptr_t local_a0;
  undefined1 local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_c8 = this->scale;
  local_a0 = (this->reflectance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_58 = *(undefined8 *)(param_5->lambda).values;
  uStack_50 = *(undefined8 *)((param_5->lambda).values + 2);
  uStack_48 = *(undefined8 *)(param_5->pdf).values;
  uStack_40 = *(undefined8 *)((param_5->pdf).values + 2);
  auVar12 = ZEXT856(param_10);
  auVar17 = ZEXT856(param_2);
  ctx._8_8_ = param_10;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx._32_8_ = param_13;
  ctx._40_8_ = param_14;
  ctx._48_8_ = param_15;
  ctx._56_8_ = param_16;
  fStack_c4 = local_c8;
  fStack_c0 = local_c8;
  fStack_bc = local_c8;
  SVar18 = UniversalTextureEvaluator::operator()
                     (&local_d9,(SpectrumTextureHandle)&local_a0,ctx,*param_5);
  auVar15._0_8_ = SVar18.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar10._0_8_ = SVar18.values.values._0_8_;
  auVar10._8_56_ = auVar12;
  auVar1 = vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
  auVar8._0_4_ = auVar1._0_4_ * local_c8;
  auVar8._4_4_ = auVar1._4_4_ * fStack_c4;
  auVar8._8_4_ = auVar1._8_4_ * fStack_c0;
  auVar8._12_4_ = auVar1._12_4_ * fStack_bc;
  local_a8 = (this->transmittance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_d8._4_4_ = this->scale;
  local_d8._0_4_ = local_d8._4_4_;
  FStack_d0 = (Float)local_d8._4_4_;
  FStack_cc = (Float)local_d8._4_4_;
  uVar3 = vcmpps_avx512vl(auVar8,ZEXT816(0) << 0x40,5);
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  local_c8 = (float)CONCAT22(local_c8._2_2_,(short)uVar3);
  auVar1 = vminps_avx(auVar13,auVar8);
  local_98 = ZEXT1632(auVar1);
  uVar19 = *(undefined8 *)(param_5->lambda).values;
  uStack_70 = *(undefined8 *)((param_5->lambda).values + 2);
  uStack_68 = *(undefined8 *)(param_5->pdf).values;
  uStack_60 = *(undefined8 *)((param_5->pdf).values + 2);
  auVar12 = ZEXT856(param_10);
  auVar17 = ZEXT856(auVar13._8_8_);
  ctx_00._8_8_ = param_10;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_00._32_8_ = param_13;
  ctx_00._40_8_ = param_14;
  ctx_00._48_8_ = param_15;
  ctx_00._56_8_ = param_16;
  local_78 = uVar19;
  SVar18 = UniversalTextureEvaluator::operator()
                     (&local_d9,(SpectrumTextureHandle)&local_a8,ctx_00,*param_5);
  auVar16._0_8_ = SVar18.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar11._0_8_ = SVar18.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  auVar1 = vmovlhps_avx(auVar11._0_16_,auVar16._0_16_);
  auVar9._0_4_ = auVar1._0_4_ * (float)local_d8._0_4_;
  auVar9._4_4_ = auVar1._4_4_ * (float)local_d8._4_4_;
  auVar9._8_4_ = auVar1._8_4_ * FStack_d0;
  auVar9._12_4_ = auVar1._12_4_ * FStack_cc;
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  uVar3 = vcmpps_avx512vl(auVar9,_DAT_004fb010,5);
  local_b0 = (this->sigma).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  _local_d8 = vminps_avx(auVar14,auVar9);
  ctx_01._8_8_ = param_10;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_01._32_8_ = param_13;
  ctx_01._40_8_ = param_14;
  ctx_01._48_8_ = param_15;
  ctx_01._56_8_ = param_16;
  FVar7 = UniversalTextureEvaluator::operator()(&local_d9,(FloatTextureHandle)&local_b0,ctx_01);
  bVar5 = SUB41(local_c8,0);
  bVar4 = bVar5 | (char)uVar3 << 4;
  fVar2 = FVar7 * 0.017453292 * FVar7 * 0.017453292;
  auVar1._8_8_ = uVar19;
  auVar1._0_8_ = param_16;
  auVar6 = vinsertf32x4_avx512vl(local_98,auVar1,1);
  *param_6 = (uint)(bVar5 & 1) * auVar6._0_4_;
  param_6[1] = (uint)((bVar5 & 2) >> 1) * auVar6._4_4_;
  param_6[2] = (uint)((bVar5 & 4) >> 2) * auVar6._8_4_;
  param_6[3] = (uint)((bVar5 & 8) >> 3) * auVar6._12_4_;
  param_6[4] = (uint)(bVar4 >> 4 & 1) * auVar6._16_4_;
  param_6[5] = (uint)(bVar4 >> 5 & 1) * auVar6._20_4_;
  param_6[6] = (uint)(bVar4 >> 6 & 1) * auVar6._24_4_;
  param_6[7] = (uint)(bVar4 >> 7) * auVar6._28_4_;
  param_6[8] = (int)(1.0 - fVar2 / (fVar2 + 0.33 + fVar2 + 0.33));
  param_6[9] = (int)((fVar2 * 0.45) / (fVar2 + 0.09));
  local_b8.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_6 | 0x2000000000000);
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_b8,1.0);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        SampledSpectrum r = Clamp(scale * texEval(reflectance, ctx, lambda), 0, 1);
        SampledSpectrum t = Clamp(scale * texEval(transmittance, ctx, lambda), 0, 1);
        Float s = texEval(sigma, ctx);
        *bxdf = DiffuseBxDF(r, t, s);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }